

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execCmp<(moira::Instr)37,(moira::Mode)3,(moira::Size)1>(Moira *this,u16 opcode)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  u32 uVar5;
  ulong in_RAX;
  long lVar6;
  u32 data;
  u32 ea;
  undefined8 local_18;
  
  local_18 = in_RAX;
  bVar4 = readOp<(moira::Mode)3,(moira::Size)1,0ul>
                    (this,opcode & 7,(u32 *)((long)&local_18 + 4),(u32 *)&local_18);
  if (bVar4) {
    uVar1 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
    lVar6 = (ulong)(uVar1 & 0xff) - (local_18 & 0xffffffff);
    (this->reg).sr.c = (bool)((byte)((ulong)lVar6 >> 8) & 1);
    bVar2 = (byte)lVar6;
    bVar3 = (byte)uVar1;
    (this->reg).sr.v = (bool)((byte)(((byte)local_18 ^ bVar3) & (bVar2 ^ bVar3)) >> 7);
    (this->reg).sr.z = bVar2 == 0;
    (this->reg).sr.n = (bool)(bVar2 >> 7);
    uVar5 = (this->reg).pc;
    (this->reg).pc0 = uVar5;
    (this->queue).ird = (this->queue).irc;
    uVar5 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar5 + 2);
    (this->queue).irc = (u16)uVar5;
  }
  return;
}

Assistant:

void
Moira::execCmp(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    cmp<S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(2);
}